

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptParameterDeclaration(HlslGrammar *this,TFunction *function)

{
  TArraySizes *pTVar1;
  bool bVar2;
  int iVar3;
  TType *this_00;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  TAttributes *s;
  HlslToken *loc;
  HlslParseContext *pHVar6;
  _func_int **pp_Var7;
  TIntermTyped *defaultValue;
  TArraySizes *arraySizes;
  TAttributes attributes;
  HlslToken idToken;
  TParameter param;
  
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       &attributes.
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node.super__List_node_base;
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = 0;
  s = &attributes;
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       attributes.
       super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  acceptAttributes(this,&attributes);
  this_00 = (TType *)TType::operator_new((TType *)0x98,(size_t)s);
  TType::TType(this_00,EbtVoid,EvqTemporary,1,0,0,false);
  bVar2 = acceptFullySpecifiedType(this,this_00,&attributes);
  if (!bVar2) {
    return false;
  }
  loc = &(this->super_HlslTokenStream).token;
  HlslParseContext::transferTypeAttributes(this->parseContext,&loc->loc,&attributes,this_00,false);
  idToken.field_2.string = (TString *)0x0;
  idToken.loc.name = (TString *)0x0;
  idToken.loc.string = 0;
  idToken.loc.line = 0;
  idToken.loc.column = 0;
  acceptIdentifier(this,&idToken);
  arraySizes = (TArraySizes *)0x0;
  acceptArraySpecifier(this,&arraySizes);
  pTVar1 = arraySizes;
  if (arraySizes != (TArraySizes *)0x0) {
    bVar2 = TArraySizes::hasUnsized(arraySizes);
    if (bVar2) {
      pHVar6 = this->parseContext;
      pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar5 = "function parameter requires array size";
      pcVar4 = "[]";
      goto LAB_003344e2;
    }
    this_00->arraySizes = pTVar1;
  }
  iVar3 = (*this_00->_vptr_TType[10])(this_00);
  acceptPostDecls(this,(TQualifier *)CONCAT44(extraout_var,iVar3));
  bVar2 = acceptDefaultParameterDeclaration(this,this_00,&defaultValue);
  if (!bVar2) {
    return false;
  }
  HlslParseContext::paramFix(this->parseContext,this_00);
  if ((defaultValue != (TIntermTyped *)0x0) ||
     (iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x25])(function), iVar3 < 1)) {
    (*(function->super_TSymbol)._vptr_TSymbol[0x16])(function);
    return true;
  }
  pHVar6 = this->parseContext;
  loc = &idToken;
  pcVar4 = ((idToken.field_2.string)->_M_dataplus)._M_p;
  pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar5 = "invalid parameter after default value parameters";
LAB_003344e2:
  (*pp_Var7[0x2d])(pHVar6,loc,pcVar5,pcVar4,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptParameterDeclaration(TFunction& function)
{
    // attributes
    TAttributes attributes;
    acceptAttributes(attributes);

    // fully_specified_type
    TType* type = new TType;
    if (! acceptFullySpecifiedType(*type, attributes))
        return false;

    // merge in the attributes
    parseContext.transferTypeAttributes(token.loc, attributes, *type);

    // identifier
    HlslToken idToken;
    acceptIdentifier(idToken);

    // array_specifier
    TArraySizes* arraySizes = nullptr;
    acceptArraySpecifier(arraySizes);
    if (arraySizes) {
        if (arraySizes->hasUnsized()) {
            parseContext.error(token.loc, "function parameter requires array size", "[]", "");
            return false;
        }

        type->transferArraySizes(arraySizes);
    }

    // post_decls
    acceptPostDecls(type->getQualifier());

    TIntermTyped* defaultValue;
    if (!acceptDefaultParameterDeclaration(*type, defaultValue))
        return false;

    parseContext.paramFix(*type);

    // If any prior parameters have default values, all the parameters after that must as well.
    if (defaultValue == nullptr && function.getDefaultParamCount() > 0) {
        parseContext.error(idToken.loc, "invalid parameter after default value parameters", idToken.string->c_str(), "");
        return false;
    }

    TParameter param = { idToken.string, type, defaultValue };
    function.addParameter(param);

    return true;
}